

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_orphaned_memorydata(NetOptimize *this)

{
  long lVar1;
  int iVar2;
  Layer *pLVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar9 = (ulong)((long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_Net).layers.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar8 = (int)uVar9;
  uVar6 = 0;
  if (0 < iVar8) {
    uVar6 = uVar9 & 0xffffffff;
  }
  uVar9 = 0;
  do {
    if (uVar9 == uVar6) {
      return 0;
    }
    bVar5 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"MemoryData");
    if (!bVar5) {
      iVar2 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar11 = uVar9;
      while (uVar10 = uVar11, uVar11 = uVar10 + 1, (int)uVar11 < iVar8) {
        bVar5 = std::operator==(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10 + 1]->type,
                                "ncnnfused");
        if (!bVar5) {
          pLVar3 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10 + 1];
          lVar4 = *(long *)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          lVar7 = 0;
          while ((long)*(pointer *)
                        ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar4 >> 2 != lVar7) {
            lVar1 = lVar7 * 4;
            lVar7 = lVar7 + 1;
            if (*(int *)(lVar4 + lVar1) == iVar2) goto LAB_00113ec4;
          }
        }
      }
      fprintf(_stderr,"eliminate_orphaned_memorydata %s\n",
              ((this->super_Net).layers.
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9]->name)._M_dataplus._M_p);
      std::__cxx11::string::assign
                ((char *)&(this->super_Net).layers.
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar9]->type);
    }
LAB_00113ec4:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_orphaned_memorydata()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - X
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool orphaned = true;
            for (int k=0; k<layers[j]->bottoms.size(); k++)
            {
                if (layers[j]->bottoms[k] == top_blob_index)
                {
                    orphaned = false;
                    break;
                }
            }

            if (!orphaned)
                break;
        }

        if (j < layer_count)
            continue;

        // assert orphaned == true
        fprintf(stderr, "eliminate_orphaned_memorydata %s\n", layers[i]->name.c_str());

        layers[i]->type = "ncnnfused";
    }

    return 0;
}